

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::tryPumpFrom
          (HttpChunkedEntityWriter *this,AsyncInputStream *input,uint64_t amount)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar1;
  bool bVar2;
  Maybe<kj::Promise<unsigned_long>_> MVar3;
  char local_38;
  undefined7 uStack_37;
  
  (**(code **)(*(long *)amount + 0x10))(&local_38,amount);
  bVar2 = local_38 == '\x01';
  aVar1 = extraout_RDX;
  if (bVar2) {
    pumpImpl((HttpChunkedEntityWriter *)&local_38,input,amount);
    (this->super_HttpEntityBodyWriter).weakInner.ptr =
         (HttpOutputStream *)CONCAT71(uStack_37,local_38);
    aVar1 = extraout_RDX_00;
  }
  *(bool *)&(this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
       bVar2;
  MVar3.ptr.field_1 = aVar1;
  MVar3.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar3.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input, uint64_t amount) override {
    KJ_IF_SOME(l, input.tryGetLength()) {
      return pumpImpl(input, kj::min(amount, l));
    } else {
      // Need to use naive read/write loop.
      return kj::none;
    }